

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::TestPlusArgsFunction::TestPlusArgsFunction
          (TestPlusArgsFunction *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  Type *this_00;
  long in_RSI;
  undefined8 *in_RDI;
  undefined1 isMethod;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *argTypes;
  size_t in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  KnownSystemName in_stack_ffffffffffffffbc;
  iterator ppTVar1;
  size_type sVar2;
  
  isMethod = (undefined1)((ulong)(in_RSI + 0x210) >> 0x38);
  this_00 = (Type *)(in_RSI + 0x5c0);
  ppTVar1 = (iterator)&stack0xffffffffffffffc0;
  sVar2 = 1;
  argTypes = (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &stack0xffffffffffffffbf;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xb08849);
  __l._M_len = sVar2;
  __l._M_array = ppTVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)this_00,
             __l,(allocator_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  NonConstantFunction::NonConstantFunction
            ((NonConstantFunction *)this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,argTypes,(bool)isMethod);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (argTypes);
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)&stack0xffffffffffffffbf);
  *in_RDI = &PTR__TestPlusArgsFunction_00ff5550;
  return;
}

Assistant:

TestPlusArgsFunction(const Builtins& builtins) :
        NonConstantFunction(KnownSystemName::TestPlusArgs, builtins.intType, 1,
                            std::vector<const Type*>{&builtins.stringType}) {}